

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SquareMatrix.hpp
# Opt level: O3

void __thiscall
qclab::dense::SquareMatrix<std::complex<double>_>::SquareMatrix
          (SquareMatrix<std::complex<double>_> *this,int64_t size,complex<double> value)

{
  complex<double> *__s;
  complex<double> *pcVar1;
  ulong uVar2;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  
  this->size_ = size;
  if (size == 0) {
    __assert_fail("size > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/include/qclab/dense/memory.hpp"
                  ,0x12,
                  "auto qclab::dense::alloc_unique_array(const int64_t) [T = std::complex<double>]")
    ;
  }
  uVar2 = size * size;
  __s = (complex<double> *)operator_new__(-(ulong)(uVar2 >> 0x3c != 0) | uVar2 * 0x10);
  memset(__s,0,uVar2 * 0x10);
  pcVar1 = __s;
  do {
    *(undefined8 *)pcVar1->_M_value = in_XMM0_Qa;
    *(undefined8 *)((long)pcVar1->_M_value + 8) = in_XMM1_Qa;
    pcVar1 = pcVar1 + 1;
  } while (pcVar1 != __s + uVar2);
  (this->data_)._M_t.
  super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>._M_t.
  super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>.
  super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl = __s;
  if (0 < size) {
    return;
  }
  __assert_fail("size > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/include/qclab/dense/SquareMatrix.hpp"
                ,0x35,
                "qclab::dense::SquareMatrix<std::complex<double>>::SquareMatrix(const int64_t, const T) [T = std::complex<double>]"
               );
}

Assistant:

SquareMatrix( const int64_t size , const T value )
        : size_( size )
        , data_( init_unique_array< T >( size * size , value ) )
        {
          assert( size > 0 ) ;
        }